

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLParsingTools.hpp
# Opt level: O3

string * __thiscall
Diligent::Parsing::
ExtractGLSLImageFormatFromComment<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (string *__return_storage_ptr__,Parsing *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *Start,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *End)

{
  byte *pbVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Pos_1;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte bVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Pos;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  pbVar3 = *(byte **)this;
  pbVar1 = (byte *)Start->_M_current;
  pbVar4 = pbVar3;
  while (((pbVar1 != pbVar3 && (pbVar4 = pbVar3, (ulong)*pbVar3 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
    pbVar3 = pbVar3 + 1;
    pbVar4 = pbVar1;
  }
  if (((pbVar4 != pbVar1) && (*pbVar4 == 0x2f)) &&
     ((pbVar4 + 1 != pbVar1 && ((bVar6 = pbVar4[1], bVar6 == 0x2a || (bVar6 == 0x2f)))))) {
    pbVar4 = pbVar4 + 2;
    pbVar3 = pbVar4;
    while (((pbVar1 != pbVar4 && (pbVar3 = pbVar4, (ulong)*pbVar4 < 0x21)) &&
           ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
      pbVar4 = pbVar4 + 1;
      pbVar3 = pbVar1;
    }
    if (pbVar3 != pbVar1) {
      bVar6 = 0x66;
      pbVar5 = (byte *)0x33f059;
      pbVar4 = pbVar3;
      do {
        if (bVar6 != *pbVar3) goto LAB_0020771a;
        pbVar3 = pbVar3 + 1;
        bVar6 = *pbVar5;
        pbVar4 = pbVar4 + 1;
      } while ((bVar6 != 0) && (pbVar5 = pbVar5 + 1, pbVar3 != pbVar1));
      if (bVar6 == 0) {
        pbVar5 = pbVar3;
        if (pbVar3 != pbVar1) {
          pbVar4 = pbVar3 + ((long)pbVar1 - (long)pbVar4);
          do {
            pbVar5 = pbVar3;
            if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0))
            break;
            pbVar3 = pbVar3 + 1;
            pbVar5 = pbVar4;
          } while (pbVar3 != pbVar1);
        }
        if ((pbVar5 != pbVar1) && (*pbVar5 == 0x3d)) {
          pbVar5 = pbVar5 + 1;
          local_18._M_current = (char *)pbVar5;
          while (((pbVar1 != pbVar5 && (local_18._M_current = (char *)pbVar5, (ulong)*pbVar5 < 0x21)
                  ) && ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0))) {
            pbVar5 = pbVar5 + 1;
            local_18._M_current = (char *)pbVar1;
          }
          if ((byte *)local_18._M_current != pbVar1) {
            _Var2 = SkipIdentifier<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                              (&local_18,Start);
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      ((string *)__return_storage_ptr__,local_18._M_current,_Var2._M_current);
            return __return_storage_ptr__;
          }
        }
      }
    }
  }
LAB_0020771a:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string ExtractGLSLImageFormatFromComment(const InteratorType& Start, const InteratorType& End)
{
    //    /* format = r32f */
    // ^
    auto Pos = SkipDelimiters(Start, End);
    if (Pos == End)
        return {};

    //    /* format = r32f */
    //    ^
    if (*Pos != '/')
        return {};

    ++Pos;
    //    /* format = r32f */
    //     ^
    //    // format = r32f
    //     ^
    if (Pos == End || (*Pos != '/' && *Pos != '*'))
        return {};

    ++Pos;
    //    /* format = r32f */
    //      ^
    Pos = SkipDelimiters(Pos, End);
    if (Pos == End)
        return {};

    //    /* format = r32f */
    //       ^
    if (!SkipString(Pos, End, "format", Pos))
        return {};

    //    /* format = r32f */
    //             ^
    Pos = SkipDelimiters(Pos, End);
    if (Pos == End)
        return {};

    //    /* format = r32f */
    //              ^
    if (*Pos != '=')
        return {};

    ++Pos;
    //    /* format = r32f */
    //               ^
    Pos = SkipDelimiters(Pos, End);
    if (Pos == End)
        return {};

    //    /* format = r32f */
    //                ^

    auto ImgFmtEndPos = SkipIdentifier(Pos, End);
    return {Pos, ImgFmtEndPos};
}